

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

uint32 __thiscall
Js::ByteCodeBufferBuilder::AddReferencedPropertyIdMap
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,FunctionBody *function)

{
  uint32 uVar1;
  PropertyId PVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint i;
  uint mapIndex;
  
  uVar1 = FunctionBody::GetCountField(function,ReferencedPropertyIdCount);
  if (uVar1 == 0) {
    uVar4 = 0;
  }
  else {
    mapIndex = 0;
    uVar4 = 0;
    do {
      PVar2 = FunctionBody::GetReferencedPropertyIdWithMapIndex(function,mapIndex);
      PVar2 = encodeNonBuiltinPropertyId(this,PVar2);
      uVar3 = PrependInt32(this,builder,L"ReferencedPropertyId",PVar2,(BufferBuilderInt32 **)0x0);
      uVar4 = uVar4 + uVar3;
      mapIndex = mapIndex + 1;
    } while (uVar1 != mapIndex);
  }
  return uVar4;
}

Assistant:

uint32 AddReferencedPropertyIdMap(BufferBuilderList & builder, FunctionBody * function)
    {
        uint count = function->GetReferencedPropertyIdCount();
        if (count == 0)
        {
            return 0;
        }
        uint32 size = 0;

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        PrependInt32(builder, _u("Start Referenced-PropertyId map"), magicStartOfReferencedPropIdMap);
#endif

        for (uint i = 0; i < count; i++)
        {
            PropertyId propertyId = encodeNonBuiltinPropertyId(function->GetReferencedPropertyIdWithMapIndex(i));
            size += PrependInt32(builder, _u("ReferencedPropertyId"), propertyId);
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("End Referenced-PropertyId map"), magicEndOfReferencedPropIdMap);
#endif

        return size;
    }